

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

bool __thiscall
ON_TextureMapping::SetCylinderMapping(ON_TextureMapping *this,ON_Cylinder *cylinder,bool bIsCapped)

{
  double dVar1;
  ON_Interval dz;
  ON_Interval dy;
  ON_Interval dx;
  bool bVar2;
  double *pdVar3;
  double dStack_50;
  bool rc;
  double r;
  ON_Interval dh;
  ON_Interval dr;
  bool bIsCapped_local;
  ON_Cylinder *cylinder_local;
  ON_TextureMapping *this_local;
  
  ON_Interval::ON_Interval((ON_Interval *)(dh.m_t + 1));
  ON_Interval::ON_Interval((ON_Interval *)&r);
  bVar2 = ON_IsValid((cylinder->circle).radius);
  if (bVar2) {
    dStack_50 = (cylinder->circle).radius;
    if ((dStack_50 == 0.0) && (!NAN(dStack_50))) {
      dStack_50 = 1.0;
    }
    ON_Interval::Set((ON_Interval *)(dh.m_t + 1),-dStack_50,dStack_50);
    ON_Interval::Set((ON_Interval *)&r,cylinder->height[0],cylinder->height[1]);
    pdVar3 = ON_Interval::operator[]((ON_Interval *)&r,0);
    dVar1 = *pdVar3;
    pdVar3 = ON_Interval::operator[]((ON_Interval *)&r,1);
    if ((dVar1 == *pdVar3) && (!NAN(dVar1) && !NAN(*pdVar3))) {
      pdVar3 = ON_Interval::operator[]((ON_Interval *)&r,0);
      if ((*pdVar3 != -1.23432101234321e+308) || (NAN(*pdVar3))) {
        r = (r - 1.0) + 1.0;
      }
      else {
        ON_Interval::Set((ON_Interval *)&r,-1.0,1.0);
      }
    }
    bVar2 = ON_Interval::IsValid((ON_Interval *)&r);
    if (bVar2) {
      dx.m_t[1] = dr.m_t[0];
      dx.m_t[0] = dh.m_t[1];
      dy.m_t[1] = dr.m_t[0];
      dy.m_t[0] = dh.m_t[1];
      dz.m_t[1] = dh.m_t[0];
      dz.m_t[0] = r;
      this_local._7_1_ = SetBoxMapping(this,(ON_Plane *)cylinder,dx,dy,dz,bIsCapped);
      if (this_local._7_1_) {
        this->m_type = cylinder_mapping;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_TextureMapping::SetCylinderMapping(const ON_Cylinder& cylinder, bool bIsCapped)
{
  ON_Interval dr, dh;
  if ( !ON_IsValid(cylinder.circle.radius ) )
    return false;
  double r = cylinder.circle.radius;
  if ( 0.0 == r )
    r = 1.0;
  dr.Set(-r,r);
  dh.Set(cylinder.height[0],cylinder.height[1]);
  if ( dh[0] == dh[1] )
  {
    if ( ON_UNSET_VALUE == dh[0] )
    {
      dh.Set(-1.0,1.0);
    }
    else
    {
      dh.m_t[0] -= 1.0;
      dh.m_t[0] += 1.0;
    }
  }
  if ( !dh.IsValid() )
    return false;

  bool rc = SetBoxMapping(cylinder.circle.plane,dr,dr,dh,bIsCapped);
  if (rc)
  {
	  m_type = ON_TextureMapping::TYPE::cylinder_mapping;
  }

	return rc;
}